

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Expression * __thiscall
wasm::Builder::replaceWithIdenticalType<wasm::Block>(Builder *this,Block *curr)

{
  Type *this_00;
  _Storage<wasm::Type,_true> _Var1;
  bool bVar2;
  BasicHeapType BVar3;
  Shareability SVar4;
  HeapType HVar5;
  Const *pCVar6;
  Block *pBVar7;
  _Storage<wasm::Type,_true> type;
  Literal *this_01;
  RefNull *output;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  Literals local_d0;
  HeapType HStack_98;
  array<unsigned_char,_16UL> bytes;
  Literal local_80;
  undefined1 auStack_68 [8];
  Literal value;
  anon_union_16_6_1532cd5a_for_Literal_0 local_48;
  undefined8 local_38;
  
  this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type;
  _Var1 = (_Storage<wasm::Type,_true>)
          (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
  type = _Var1;
  if (((ulong)_Var1 & 1) != 0 && 6 < (ulong)_Var1) {
    bVar2 = wasm::Type::isDefaultable(this_00);
    type._M_value.id = (Type)this_00->id;
    if (!bVar2) goto LAB_00b7779b;
    Literal::makeZeros(&local_d0,type._M_value);
    curr = (Block *)makeConstantExpression(this,&local_d0);
    if ((_Storage<wasm::Type,_true>)
        (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id != _Var1)
    {
      auStack_68 = (undefined1  [8])&local_48;
      value.field_0.i64 = 1;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 1;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload._M_value.id = (Type)(Type)_Var1;
      local_48.exnData.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)curr;
      curr = makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                       (this,(initializer_list<wasm::Expression_*> *)auStack_68,type_00);
    }
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              (&local_d0.super_SmallVector<wasm::Literal,_1UL>.flexible);
    this_01 = local_d0.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems;
    goto LAB_00b779e4;
  }
LAB_00b7779b:
  if ((type._0_4_ & 3) == 2 && 6 < (ulong)type) {
    auStack_68 = (undefined1  [8])wasm::Type::getHeapType(this_00);
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = RefNullId;
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    BVar3 = HeapType::getBottom((HeapType *)auStack_68);
    if (((uint)(0x7c < BVar3) * 4 + 3 & BVar3) != 0) {
      __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
    }
    RefNull::finalize((RefNull *)curr,(Type)((ulong)BVar3 | 2));
LAB_00b77893:
    if ((_Storage<wasm::Type,_true>)
        (((SpecificExpression<(wasm::Expression::Id)59> *)
         &curr->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression).type.id ==
        _Var1) {
      return (Expression *)curr;
    }
    auStack_68 = (undefined1  [8])&local_48;
    value.field_0.i64 = 1;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 1;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload._M_value.id = (Type)(Type)_Var1;
    local_48.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)curr;
    pBVar7 = makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                       (this,(initializer_list<wasm::Expression_*> *)auStack_68,type_01);
    return (Expression *)pBVar7;
  }
  if (((ulong)type & 1) == 0 && 6 < (ulong)type) {
    HVar5 = wasm::Type::getHeapType(this_00);
    if (HVar5.id < 0x7d && ((uint)HVar5.id & 0x7b) == 0x30) {
      pCVar6 = makeConst<int>(this,0);
      HStack_98 = wasm::Type::getHeapType(this_00);
      SVar4 = HeapType::getShared(&HStack_98);
      curr = (Block *)MixedArena::allocSpace(&this->wasm->allocator,0x18,8);
      (((SpecificExpression<(wasm::Expression::Id)59> *)
       &curr->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression)._id = RefI31Id;
      (curr->name).super_IString.str._M_len = (size_t)pCVar6;
      (((SpecificExpression<(wasm::Expression::Id)59> *)
       &curr->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression).type.id =
           (ulong)(SVar4 == Shared) * 4 + 0x30;
      RefI31::finalize((RefI31 *)curr);
      goto LAB_00b77893;
    }
    type._M_value.id = (Type)this_00->id;
  }
  auStack_68 = (undefined1  [8])0x0;
  value.field_0.i64 = 0;
  value.field_0.func.super_IString.str._M_str = (char *)0x0;
  switch(type) {
  case (_Storage<wasm::Type,_true>)0x0:
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = NopId;
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    goto LAB_00b779e0;
  case (_Storage<wasm::Type,_true>)0x1:
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = UnreachableId;
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 1;
    goto LAB_00b779e0;
  case (_Storage<wasm::Type,_true>)0x2:
    local_48.func.super_IString.str._M_len =
         (ulong)(uint)local_48.func.super_IString.str._M_len._4_4_ << 0x20;
    local_38 = 2;
    Literal::operator=((Literal *)auStack_68,(Literal *)&local_48.func);
    break;
  case (_Storage<wasm::Type,_true>)0x3:
    local_48.i64 = 0;
    local_38 = 3;
    Literal::operator=((Literal *)auStack_68,(Literal *)&local_48.func);
    break;
  case (_Storage<wasm::Type,_true>)0x4:
    local_48.func.super_IString.str._M_len =
         (ulong)(uint)local_48.func.super_IString.str._M_len._4_4_ << 0x20;
    local_38 = 4;
    Literal::operator=((Literal *)auStack_68,(Literal *)&local_48.func);
    break;
  case (_Storage<wasm::Type,_true>)0x5:
    local_48.i64 = 0;
    local_38 = 5;
    Literal::operator=((Literal *)auStack_68,(Literal *)&local_48.func);
    break;
  case (_Storage<wasm::Type,_true>)0x6:
    HStack_98.id = 0;
    bytes._M_elems[0] = '\0';
    bytes._M_elems[1] = '\0';
    bytes._M_elems[2] = '\0';
    bytes._M_elems[3] = '\0';
    bytes._M_elems[4] = '\0';
    bytes._M_elems[5] = '\0';
    bytes._M_elems[6] = '\0';
    bytes._M_elems[7] = '\0';
    Literal::Literal((Literal *)&local_48.func,(uint8_t *)&HStack_98);
    Literal::operator=((Literal *)auStack_68,(Literal *)&local_48.func);
    break;
  default:
    goto switchD_00b778f8_default;
  }
  Literal::~Literal((Literal *)&local_48.func);
  Literal::Literal(&local_80,(Literal *)auStack_68);
  curr = (Block *)makeConst(this,&local_80);
  Literal::~Literal(&local_80);
LAB_00b779e0:
  this_01 = (Literal *)auStack_68;
LAB_00b779e4:
  Literal::~Literal(this_01);
switchD_00b778f8_default:
  return (Expression *)curr;
}

Assistant:

Expression* replaceWithIdenticalType(T* curr) {
    auto type = curr->type;
    // Anything that would otherwise have a more refined type than the original
    // expression needs to be wrapped in a block with the original type.
    auto maybeWrap = [&](Expression* expr) -> Expression* {
      return expr->type == type ? expr : makeBlock({expr}, type);
    };
    if (curr->type.isTuple() && curr->type.isDefaultable()) {
      return maybeWrap(makeConstantExpression(Literal::makeZeros(curr->type)));
    }
    if (curr->type.isNullable()) {
      return maybeWrap(
        ExpressionManipulator::refNull(curr, curr->type.getHeapType()));
    }
    if (curr->type.isRef() &&
        curr->type.getHeapType().isMaybeShared(HeapType::i31)) {
      return maybeWrap(
        makeRefI31(makeConst(0), curr->type.getHeapType().getShared()));
    }
    if (!curr->type.isBasic()) {
      // We can't do any better, keep the original.
      return curr;
    }
    Literal value;
    // TODO: reuse node conditionally when possible for literals
    switch (curr->type.getBasic()) {
      case Type::i32:
        value = Literal(int32_t(0));
        break;
      case Type::i64:
        value = Literal(int64_t(0));
        break;
      case Type::f32:
        value = Literal(float(0));
        break;
      case Type::f64:
        value = Literal(double(0));
        break;
      case Type::v128: {
        std::array<uint8_t, 16> bytes;
        bytes.fill(0);
        value = Literal(bytes.data());
        break;
      }
      case Type::none:
        return ExpressionManipulator::nop(curr);
      case Type::unreachable:
        return ExpressionManipulator::unreachable(curr);
    }
    return makeConst(value);
  }